

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRTables.cpp
# Opt level: O0

void init_lr_tables(void)

{
  initializer_list<Token> __l;
  mapped_type *this;
  Token *local_108;
  key_type local_cc;
  initializer_list<TableElement> local_c8;
  undefined1 local_b4;
  allocator<Token> local_b3;
  undefined1 local_b2;
  allocator local_b1;
  Token *local_b0;
  Token local_a8;
  iterator local_68;
  size_type local_60;
  allocator local_41;
  value_type local_40;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"A",&local_41);
  local_b4 = 1;
  local_b2 = 1;
  local_b0 = &local_a8;
  local_a8.syn = ~ERROR;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8.token,"s",&local_b1);
  local_a8.start_pos.row = 0;
  local_a8.start_pos.col = 0;
  local_a8.start_pos.index = 0;
  local_a8.end_pos.row = 0;
  local_a8.end_pos.col = 0;
  local_a8.end_pos.index = 0;
  local_b2 = 0;
  local_68 = &local_a8;
  local_60 = 1;
  std::allocator<Token>::allocator(&local_b3);
  __l._M_len = local_60;
  __l._M_array = local_68;
  std::vector<Token,_std::allocator<Token>_>::vector(&local_40.right,__l,&local_b3);
  local_b4 = 0;
  std::vector<GenExpr,_std::allocator<GenExpr>_>::push_back(&gen_expressions,&local_40);
  GenExpr::~GenExpr(&local_40);
  std::allocator<Token>::~allocator(&local_b3);
  local_108 = (Token *)&local_68;
  do {
    local_108 = local_108 + -1;
    Token::~Token(local_108);
  } while (local_108 != &local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::initializer_list<TableElement>::initializer_list(&local_c8);
  local_cc = SYN_VERTICAL_LINE;
  this = std::
         map<TOKEN_SYN,_std::vector<TableElement,_std::allocator<TableElement>_>,_std::less<TOKEN_SYN>,_std::allocator<std::pair<const_TOKEN_SYN,_std::vector<TableElement,_std::allocator<TableElement>_>_>_>_>
         ::operator[](&action_table,&local_cc);
  std::vector<TableElement,_std::allocator<TableElement>_>::operator=(this,local_c8);
  return;
}

Assistant:

void init_lr_tables(){
    gen_expressions.push_back({"A", {{.token="s"}}});

    action_table[TOKEN_SYN::SYN_VERTICAL_LINE] = {};
}